

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  Printer *this_00;
  LogMessage *pLVar1;
  long lVar2;
  long lVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar5;
  int number;
  Printer *local_120;
  long local_118;
  long local_110;
  LogMessage local_108;
  set<int,_std::less<int>,_std::allocator<int>_> used_number;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  string name;
  string original_name;
  
  WriteEnumDocComment(printer,this->descriptor_);
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&local_108,&this->super_SourceGeneratorBase);
  io::Printer::Print(printer,"$access_level$ enum $name$ {\n","access_level",(string *)&local_108,
                     "name",*(string **)this->descriptor_);
  std::__cxx11::string::~string((string *)&local_108);
  local_120 = printer;
  io::Printer::Indent(printer);
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_names._M_t._M_impl.super__Rb_tree_header._M_header;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_number._M_t._M_impl.super__Rb_tree_header._M_header;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_number._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar2 = 0;
  used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (this_00 = local_120, lVar2 < *(int *)(this->descriptor_ + 0x2c)) {
    lVar3 = lVar2 * 0x28;
    local_118 = lVar2;
    WriteEnumValueDocComment
              (local_120,(EnumValueDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar3));
    std::__cxx11::string::string
              ((string *)&original_name,*(string **)(*(long *)(this->descriptor_ + 0x30) + lVar3));
    local_110 = lVar3;
    GetEnumValueName(&name,*(string **)this->descriptor_,
                     *(string **)(*(long *)(this->descriptor_ + 0x30) + lVar3));
    while( true ) {
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&used_names,&name);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
      internal::LogMessage::LogMessage
                (&local_108,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_enum.cc"
                 ,0x4c);
      pLVar1 = internal::LogMessage::operator<<(&local_108,"Duplicate enum value ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,&name);
      pLVar1 = internal::LogMessage::operator<<(pLVar1," (originally ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,&original_name);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,") in ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)this->descriptor_);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,"; adding underscore to distinguish");
      internal::LogFinisher::operator=((LogFinisher *)&number,pLVar1);
      internal::LogMessage::~LogMessage(&local_108);
      std::__cxx11::string::append((char *)&name);
    }
    number = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + local_110);
    pVar5 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &used_number,&number);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      SimpleItoa_abi_cxx11_((string *)&local_108,(protobuf *)(ulong)(uint)number,pVar5._8_4_);
      io::Printer::Print(local_120,
                         "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n"
                         ,"original_name",&original_name,"name",&name,"number",(string *)&local_108)
      ;
    }
    else {
      SimpleItoa_abi_cxx11_((string *)&local_108,(protobuf *)(ulong)(uint)number,pVar5._8_4_);
      io::Printer::Print(local_120,"[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
                         "original_name",&original_name,"name",&name,"number",(string *)&local_108);
    }
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&original_name);
    lVar2 = local_118 + 1;
  }
  io::Printer::Outdent(local_120);
  io::Printer::Print(this_00,"}\n");
  io::Printer::Print(this_00,"\n");
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&used_number._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&used_names._M_t);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  std::set<string> used_names;
  std::set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
      WriteEnumValueDocComment(printer, descriptor_->value(i));
      string original_name = descriptor_->value(i)->name();
      string name = GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
      // Make sure we don't get any duplicate names due to prefix removal.
      while (!used_names.insert(name).second) {
        // It's possible we'll end up giving this warning multiple times, but that's better than not at all.
        GOOGLE_LOG(WARNING) << "Duplicate enum value " << name << " (originally " << original_name
          << ") in " << descriptor_->name() << "; adding underscore to distinguish";
        name += "_";
      }
      int number = descriptor_->value(i)->number();
      if (!used_number.insert(number).second) {
          printer->Print("[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      } else {
          printer->Print("[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
             "original_name", original_name,
             "name", name,
             "number", SimpleItoa(number));
      }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}